

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O3

void __thiscall
pele::physics::reactions::ReactorCvode::freeUserData(ReactorCvode *this,CVODEUserData *data_wk)

{
  Arena *pAVar1;
  sunindextype ***pppsVar2;
  long lVar3;
  
  pAVar1 = amrex::The_Arena();
  (*pAVar1->_vptr_Arena[3])(pAVar1,data_wk->rYsrc_ext);
  pAVar1 = amrex::The_Arena();
  (*pAVar1->_vptr_Arena[3])(pAVar1,data_wk->rhoe_init);
  pAVar1 = amrex::The_Arena();
  (*pAVar1->_vptr_Arena[3])(pAVar1,data_wk->rhoesrc_ext);
  pAVar1 = amrex::The_Arena();
  (*pAVar1->_vptr_Arena[3])(pAVar1,data_wk->mask);
  pAVar1 = amrex::The_Arena();
  (*pAVar1->_vptr_Arena[3])(pAVar1,data_wk->FCunt);
  if (data_wk->solve_type == 4) {
    SUNMatDestroy(this->A);
    SUNMatDestroy(data_wk->PSc);
  }
  if (data_wk->precond_type == 0) {
    if (0 < data_wk->ncells) {
      lVar3 = 0;
      do {
        SUNDlsMat_destroyMat(data_wk->P[lVar3][lVar3]);
        SUNDlsMat_destroyMat(data_wk->Jbd[lVar3][lVar3]);
        SUNDlsMat_destroyArray(data_wk->pivot[lVar3][lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar3 < data_wk->ncells);
      if (0 < data_wk->ncells) {
        lVar3 = 0;
        do {
          if (data_wk->P[lVar3] != (Real ***)0x0) {
            operator_delete__(data_wk->P[lVar3]);
          }
          if (data_wk->Jbd[lVar3] != (Real ***)0x0) {
            operator_delete__(data_wk->Jbd[lVar3]);
          }
          if (data_wk->pivot[lVar3] != (sunindextype **)0x0) {
            operator_delete__(data_wk->pivot[lVar3]);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < data_wk->ncells);
      }
    }
    if (data_wk->P != (Real ****)0x0) {
      operator_delete__(data_wk->P);
    }
    if (data_wk->Jbd != (Real ****)0x0) {
      operator_delete__(data_wk->Jbd);
    }
    pppsVar2 = data_wk->pivot;
  }
  else {
    if (data_wk->precond_type != 2) goto LAB_001bb2d9;
    if (0 < data_wk->ncells) {
      lVar3 = 0;
      do {
        if (data_wk->JSPSmat[lVar3] != (Real *)0x0) {
          operator_delete__(data_wk->JSPSmat[lVar3]);
        }
        SUNMatDestroy(data_wk->PS[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar3 < data_wk->ncells);
    }
    if (data_wk->colVals != (int **)0x0) {
      operator_delete__(data_wk->colVals);
    }
    if (data_wk->rowPtrs != (int **)0x0) {
      operator_delete__(data_wk->rowPtrs);
    }
    if (data_wk->PS != (SUNMatrix *)0x0) {
      operator_delete__(data_wk->PS);
    }
    pppsVar2 = (sunindextype ***)data_wk->JSPSmat;
  }
  if (pppsVar2 != (sunindextype ***)0x0) {
    operator_delete__(pppsVar2);
  }
LAB_001bb2d9:
  operator_delete(data_wk,0xd8);
  return;
}

Assistant:

void
ReactorCvode::freeUserData(CVODEUserData* data_wk)
{
  amrex::The_Arena()->free(data_wk->rYsrc_ext);
  amrex::The_Arena()->free(data_wk->rhoe_init);
  amrex::The_Arena()->free(data_wk->rhoesrc_ext);
  amrex::The_Arena()->free(data_wk->mask);

#ifdef AMREX_USE_GPU

  if (data_wk->solve_type == cvode::sparseDirect) {
#ifdef AMREX_USE_CUDA
    amrex::The_Pinned_Arena()->free(data_wk->csr_row_count_h);
    amrex::The_Pinned_Arena()->free(data_wk->csr_col_index_h);
    cusolverStatus_t cusolver_status =
      cusolverSpDestroy(data_wk->cusolverHandle);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    cusparseStatus_t cusparse_status = cusparseDestroy(data_wk->cuSPHandle);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
#endif
  } else if (data_wk->solve_type == cvode::customDirect) {
#ifdef AMREX_USE_CUDA
    amrex::The_Pinned_Arena()->free(data_wk->csr_row_count_h);
    amrex::The_Pinned_Arena()->free(data_wk->csr_col_index_h);
    cusparseStatus_t cusparse_status = cusparseDestroy(data_wk->cuSPHandle);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
#endif
  }
  // Preconditioner analytical Jacobian data
  if (data_wk->precond_type == cvode::sparseSimpleAJac) {
#ifdef AMREX_USE_CUDA
    amrex::The_Pinned_Arena()->free(data_wk->csr_row_count_h);
    amrex::The_Pinned_Arena()->free(data_wk->csr_col_index_h);
    amrex::The_Arena()->free(data_wk->csr_row_count_d);
    amrex::The_Arena()->free(data_wk->csr_col_index_d);
    amrex::The_Arena()->free(data_wk->csr_val_d);
    amrex::The_Arena()->free(data_wk->csr_jac_d);
    cusolverStatus_t cusolver_status =
      cusolverSpDestroy(data_wk->cusolverHandle);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    cusolver_status = cusolverSpDestroyCsrqrInfo(data_wk->info);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    cudaFree(data_wk->buffer_qr);
#endif
  }
  delete data_wk;

#else
  amrex::The_Arena()->free(data_wk->FCunt);

  // Direct solver Jac. data
  if (data_wk->solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
    delete[] data_wk->colPtrs;
    delete[] data_wk->rowVals;
    delete[] data_wk->Jdata;
    SUNMatDestroy(A);
    SUNMatDestroy((data_wk->PS)[0]);
    delete[](data_wk->PS);
#endif
  } else if (data_wk->solve_type == cvode::customDirect) {
    SUNMatDestroy(A);
    SUNMatDestroy(data_wk->PSc);
  }

  // Preconditionner Jac. data
  if (data_wk->precond_type == cvode::denseSimpleAJac) {
    for (int i = 0; i < data_wk->ncells; ++i) {
      SUNDlsMat_destroyMat((data_wk->P)[i][i]);
      SUNDlsMat_destroyMat((data_wk->Jbd)[i][i]);
      SUNDlsMat_destroyArray((data_wk->pivot)[i][i]);
    }
    for (int i = 0; i < data_wk->ncells; ++i) {
      delete[](data_wk->P)[i];
      delete[](data_wk->Jbd)[i];
      delete[](data_wk->pivot)[i];
    }
    delete[](data_wk->P);
    delete[](data_wk->Jbd);
    delete[](data_wk->pivot);
  } else if (data_wk->precond_type == cvode::sparseSimpleAJac) {
#ifdef PELE_USE_KLU
    delete[] data_wk->colPtrs;
    delete[] data_wk->rowVals;
    delete[] data_wk->Jdata;
    for (int i = 0; i < data_wk->ncells; ++i) {
      klu_free_symbolic(&(data_wk->Symbolic[i]), &(data_wk->Common[i]));
      klu_free_numeric(&(data_wk->Numeric[i]), &(data_wk->Common[i]));
      delete[] data_wk->JSPSmat[i];
      SUNMatDestroy((data_wk->PS)[i]);
    }
    delete[] data_wk->JSPSmat;
    delete[] data_wk->Common;
    delete[] data_wk->Symbolic;
    delete[] data_wk->Numeric;
    delete[] data_wk->PS;
#endif
  } else if (data_wk->precond_type == cvode::customSimpleAJac) {
    for (int i = 0; i < data_wk->ncells; ++i) {
      delete[] data_wk->JSPSmat[i];
      SUNMatDestroy((data_wk->PS)[i]);
    }
    delete[] data_wk->colVals;
    delete[] data_wk->rowPtrs;
    delete[] data_wk->PS;
    delete[] data_wk->JSPSmat;
  }

  delete data_wk;
#endif
}

void
ReactorCvode::close()
{
#ifndef AMREX_USE_GPU
  CVodeFree(&cvode_mem);
  if (LS != nullptr) {
    SUNLinSolFree(LS);
  }
  if (NLS != nullptr) {
    SUNNonlinSolFree(NLS);
  }

  if (udata_g->solve_type == cvode::denseDirect) {
    SUNMatDestroy(A);
  }

  N_VDestroy(y);
  freeUserData(udata_g);
#endif
}

void
ReactorCvode::print_final_stats(void* cvodemem, bool print_ls_stats)
{
  long int nst, nfe, nsetups, nni, ncfn, netf, nje;
  long int nli, npe, nps, ncfl, nfeLS;
  int flag;

  // CVODE stats
  flag = CVodeGetNumSteps(cvodemem, &nst);
  utils::check_flag(&flag, "CVodeGetNumSteps", 1);
  flag = CVodeGetNumErrTestFails(cvodemem, &netf);
  utils::check_flag(&flag, "CVodeGetNumErrTestFails", 1);
  flag = CVodeGetNumRhsEvals(cvodemem, &nfe);
  utils::check_flag(&flag, "CVodeGetNumRhsEvals", 1);
  // Nonlinear solver stats
  flag = CVodeGetNumNonlinSolvIters(cvodemem, &nni);
  utils::check_flag(&flag, "CVodeGetNumNonlinSolvIters", 1);
  flag = CVodeGetNumNonlinSolvConvFails(cvodemem, &ncfn);
  utils::check_flag(&flag, "CVodeGetNumNonlinSolvConvFails", 1);
  if (print_ls_stats) {
    // Linear solver stats
    flag = CVodeGetNumLinSolvSetups(cvodemem, &nsetups);
    utils::check_flag(&flag, "CVodeGetNumLinSolvSetups", 1);
    flag = CVodeGetNumJacEvals(cvodemem, &nje);
    utils::check_flag(&flag, "CVodeGetNumJacEvals", 1);
    flag = CVodeGetNumLinIters(cvodemem, &nli);
    utils::check_flag(&flag, "CVodeGetNumLinIters", 1);
    flag = CVodeGetNumLinConvFails(cvodemem, &ncfl);
    utils::check_flag(&flag, "CVodeGetNumLinConvFails", 1);
    flag = CVodeGetNumLinRhsEvals(cvodemem, &nfeLS);
    utils::check_flag(&flag, "CVodeGetNumLinRhsEvals", 1);
    // Preconditioner stats
    flag = CVodeGetNumPrecEvals(cvodemem, &npe);
    utils::check_flag(&flag, "CVodeGetNumPrecEvals", 1);
    flag = CVodeGetNumPrecSolves(cvodemem, &nps);
    utils::check_flag(&flag, "CVodeGetNumPrecSolves", 1);
  }

#ifdef AMREX_USE_OMP
  amrex::Print() << "\nFinal Statistics: "
                 << "(thread:" << omp_get_thread_num() << ", ";
  amrex::Print() << "cvode_mem:" << cvodemem << ")\n";
#else
  amrex::Print() << "\nFinal Statistics:\n";
#endif
  // CVODE stats
  amrex::Print() << "  nSteps       = " << nst << "\n";
  amrex::Print() << "  nErrtf       = " << netf << "\n";
  amrex::Print() << "  nRHSeval     = " << nfe << "\n";
  // NLS stats
  amrex::Print() << "  nnLinIt      = " << nni << "\n";
  amrex::Print() << "  nConvfail    = " << ncfn << "\n";
  // LS stats
  if (print_ls_stats) {
    amrex::Print() << "  nLinsetups   = " << nsetups << "\n";
    amrex::Print() << "  nJeval       = " << nje << "\n";
    amrex::Print() << "  nLinIt       = " << nli << "\n";
    amrex::Print() << "  nLinConvfail = " << ncfl << "\n";
    amrex::Print() << "  nLinRHSeval  = " << nfeLS << "\n";
    // Prec
    amrex::Print() << "  nPreceval    = " << npe << "\n";
    amrex::Print() << "  nPrecsolve   = " << nps << "\n";
  }
}

}